

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::StrictTargetComparison::operator()
          (StrictTargetComparison *this,cmGeneratorTarget *t1,cmGeneratorTarget *t2)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cmLocalGenerator *pcVar4;
  int nameResult;
  cmGeneratorTarget *t2_local;
  cmGeneratorTarget *t1_local;
  StrictTargetComparison *this_local;
  
  cmGeneratorTarget::GetName_abi_cxx11_(t1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratorTarget::GetName_abi_cxx11_(t2);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(pcVar2,pcVar3);
  if (iVar1 == 0) {
    pcVar4 = GetLocalGenerator(t1);
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar4 = GetLocalGenerator(t2);
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar2,pcVar3);
  }
  this_local._7_1_ = iVar1 < 0;
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::StrictTargetComparison::operator()(
  cmGeneratorTarget const* t1, cmGeneratorTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(
             t1->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str(),
             t2->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str()) < 0;
  }
  return nameResult < 0;
}